

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrProc.h
# Opt level: O3

void ReadLevelFile(string *path,string *words)

{
  int iVar1;
  LevelFileReader fileReader;
  string str;
  ifstream file;
  LevelFileReader LStack_258;
  string local_250;
  ifstream local_230 [520];
  
  std::ifstream::ifstream(local_230,(string *)path,_S_in);
  LevelFileReader::LevelFileReader(&LStack_258,local_230);
  while( true ) {
    LevelFileReader::GetWord_abi_cxx11_(&local_250,&LStack_258);
    iVar1 = std::__cxx11::string::compare((char *)&local_250);
    if (iVar1 == 0) break;
    std::__cxx11::string::_M_assign((string *)words);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    words = words + 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  LevelFileReader::~LevelFileReader(&LStack_258);
  std::ifstream::~ifstream(local_230);
  return;
}

Assistant:

void ReadLevelFile(const string& path, string* words)
{
    ifstream file(path);
    LevelFileReader fileReader(file);

    for (int i = 0; true; i++)
    {
      string str = fileReader.GetWord();
      if (str == "") break;
      words[i] = str;
    }

    return;
}